

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O1

bool __thiscall CNetAddr::SetInternal(CNetAddr *this,string *name)

{
  size_type sVar1;
  CSHA256 *this_00;
  long in_FS_OFFSET;
  uchar hash [32];
  CSHA256 local_c0;
  uchar local_58 [40];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = name->_M_string_length;
  if (sVar1 != 0) {
    this->m_net = NET_INTERNAL;
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58[0x18] = '\0';
    local_58[0x19] = '\0';
    local_58[0x1a] = '\0';
    local_58[0x1b] = '\0';
    local_58[0x1c] = '\0';
    local_58[0x1d] = '\0';
    local_58[0x1e] = '\0';
    local_58[0x1f] = '\0';
    local_58[0] = '\0';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    CSHA256::CSHA256(&local_c0);
    this_00 = CSHA256::Write(&local_c0,(uchar *)(name->_M_dataplus)._M_p,name->_M_string_length);
    CSHA256::Finalize(this_00,local_58);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::assign<unsigned_char_*>
              (&this->m_addr,local_58,local_58 + 10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return sVar1 != 0;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::SetInternal(const std::string &name)
{
    if (name.empty()) {
        return false;
    }
    m_net = NET_INTERNAL;
    unsigned char hash[32] = {};
    CSHA256().Write((const unsigned char*)name.data(), name.size()).Finalize(hash);
    m_addr.assign(hash, hash + ADDR_INTERNAL_SIZE);
    return true;
}